

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

bool __thiscall
tsbp::TwoStepBranchingProcedure::IsPlacementFeasible
          (TwoStepBranchingProcedure *this,PackingRelaxed2D *packing,Rectangle *itemToPlace)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  pointer pRVar7;
  bool bVar8;
  int local_50;
  int local_4c;
  ulong local_48;
  
  uVar5 = packing->MinX;
  if ((long)itemToPlace->Dx + uVar5 <= (ulong)(long)(this->container).super_Rectangle.Dx) {
    local_50 = (this->container).super_Rectangle.Dy;
    local_48 = (ulong)local_50;
    if (((long)itemToPlace->Dy +
         (packing->PlacedAreaVector).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5] <= local_48) &&
       ((*(ulong *)(*(long *)&(this->itemSpecificPlacementPointsX).
                              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[itemToPlace->InternId].
                              m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0)) {
      pRVar7 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar8 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
              _M_impl.super__Vector_impl_data._M_finish == pRVar7;
      if (bVar8) {
        local_4c = 0;
        local_48._0_4_ = local_50;
      }
      else {
        uVar5 = 0;
        lVar6 = 0x10;
        local_4c = 0;
        do {
          bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                            (&packing->PlacedItems,(long)*(int *)((long)&pRVar7->X + lVar6));
          iVar4 = *(int *)((long)&pRVar7->X + lVar6);
          if (bVar3) {
            if ((packing->MinX ==
                 (long)(packing->ItemCoordinatesX).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar4]) &&
               (itemToPlace->InternId < iVar4)) {
              return bVar8;
            }
          }
          else {
            if (iVar4 != itemToPlace->InternId) {
              iVar1 = *(int *)((long)pRVar7 + lVar6 + -4);
              if (iVar1 < local_50) {
                local_50 = iVar1;
              }
              iVar1 = *(int *)((long)pRVar7 + lVar6 + -8);
              if (local_4c <= iVar1) {
                local_4c = iVar1;
              }
            }
            if (itemToPlace->InternId < iVar4) {
              uVar2 = *(uint *)((long)pRVar7 + lVar6 + -4);
              iVar4 = (int)local_48;
              local_48 = local_48 & 0xffffffff;
              if ((int)uVar2 < iVar4) {
                local_48 = (ulong)uVar2;
              }
            }
          }
          uVar5 = uVar5 + 1;
          pRVar7 = (this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x20;
          bVar3 = uVar5 < (ulong)((long)(this->items).
                                        super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7 >>
                                 5);
          bVar8 = !bVar3;
        } while (bVar3);
      }
      packing->MinimumRemainingItemDy = local_50;
      packing->MinimumRemainingItemDyAtCurrentX = (int)local_48;
      packing->MaximumRemainingItemDx = local_4c;
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool TwoStepBranchingProcedure::IsPlacementFeasible(PackingRelaxed2D& packing, const Rectangle& itemToPlace)
{
    // No need to check feasibility in y-direction for x > packing.MinX, because, by construction, packing.PlacedAreaVector (K(x)) is non-increasing.
    if (packing.MinX + itemToPlace.Dx > this->container.Dx || packing.PlacedAreaVector[packing.MinX] + itemToPlace.Dy > this->container.Dy)
    {
        return false;
    }

    if (!this->itemSpecificPlacementPointsX[itemToPlace.InternId][packing.MinX])
    {
        return false;
    }

    int maximumRemainingItemDx = 0;
    int minimumRemainingItemDy = this->container.Dy;
    int minimumRemainingItemDyAtCurrentX = this->container.Dy;
    for (size_t i = 0; i < items.size(); i++)
    {
        const Rectangle& item = items[i];
        // Caution, requires i == items[i].InternId
        if (packing.PlacedItems.test(item.InternId))
        {
            if (packing.ItemCoordinatesX[item.InternId] == packing.MinX
                && itemToPlace.InternId < item.InternId)
            {
                return false;
            }
        }
        else
        {
            if (item.InternId != itemToPlace.InternId)
            {
                minimumRemainingItemDy = std::min<int>(minimumRemainingItemDy, item.Dy);
                maximumRemainingItemDx = std::max<int>(maximumRemainingItemDx, item.Dx);
            }

            if (itemToPlace.InternId < item.InternId)
            {
                minimumRemainingItemDyAtCurrentX = std::min<int>(minimumRemainingItemDyAtCurrentX, item.Dy);
            }
        }
    }

    ////packing.MinimumRemainingItemDy = 0;
    ////packing.MinimumRemainingItemDyAtCurrentX = 0;
    packing.MinimumRemainingItemDy = minimumRemainingItemDy;
    packing.MinimumRemainingItemDyAtCurrentX = minimumRemainingItemDyAtCurrentX;
    packing.MaximumRemainingItemDx = maximumRemainingItemDx;

    return true;
}